

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.c
# Opt level: O3

int getopt(int ___argc,char **___argv,char *__shortopts)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  int __c;
  int iVar4;
  long lVar5;
  
  iVar4 = optind;
  optarg = (char *)0x0;
  opterr = 0;
  if (___argc <= optind) {
    optcursor = (char *)0x0;
    optopt = 0;
    opterr = 0;
    optarg = (char *)0x0;
    return -1;
  }
  lVar5 = (long)optind;
  pcVar2 = ___argv[lVar5];
  if (pcVar2 == (char *)0x0) {
    optarg = (char *)0x0;
    opterr = 0;
    optopt = 0;
    optcursor = (char *)0x0;
    return -1;
  }
  if (*pcVar2 != '-') {
    optarg = (char *)0x0;
    opterr = 0;
    optopt = 0;
    optcursor = (char *)0x0;
    return -1;
  }
  if (pcVar2[1] == '\0') {
    optarg = (char *)0x0;
    opterr = 0;
    optopt = 0;
    optcursor = (char *)0x0;
    return -1;
  }
  if ((pcVar2[1] == '-') && (pcVar2[2] == '\0')) {
    optind = optind + 1;
    optarg = (char *)0x0;
    opterr = 0;
    optopt = 0;
    optcursor = (char *)0x0;
    return -1;
  }
  if ((optcursor == (char *)0x0) || (cVar3 = *optcursor, pcVar1 = optcursor, cVar3 == '\0')) {
    cVar3 = pcVar2[1];
    pcVar1 = pcVar2 + 1;
  }
  __c = (int)cVar3;
  optopt = __c;
  pcVar2 = strchr(__shortopts,__c);
  if (pcVar2 == (char *)0x0) {
    __c = 0x3f;
  }
  else if (pcVar2[1] == ':') {
    optarg = pcVar1 + 1;
    if (pcVar1[1] == '\0') {
      if (pcVar2[2] == ':') {
        optarg = (char *)0x0;
      }
      else {
        iVar4 = iVar4 + 1;
        if (iVar4 < ___argc) {
          optarg = ___argv[lVar5 + 1];
        }
        else {
          optarg = (char *)0x0;
          __c = (uint)(*__shortopts != ':') * 5 + 0x3a;
        }
      }
    }
    optcursor = (char *)0x0;
    goto LAB_00106fba;
  }
  optcursor = pcVar1 + 1;
  if (pcVar1[1] != '\0') {
    return __c;
  }
LAB_00106fba:
  optind = iVar4 + 1;
  return __c;
}

Assistant:

int getopt(int argc, char* const argv[], const char* optstring) {
  int optchar = -1;
  const char* optdecl = NULL;

  optarg = NULL;
  opterr = 0;
  optopt = 0;

  /* Unspecified, but we need it to avoid overrunning the argv bounds. */
  if (optind >= argc)
    goto no_more_optchars;

  /* If, when getopt() is called argv[optind] is a null pointer, getopt()
     shall return -1 without changing optind. */
  if (argv[optind] == NULL)
    goto no_more_optchars;

  /* If, when getopt() is called *argv[optind]  is not the character '-',
     getopt() shall return -1 without changing optind. */
  if (*argv[optind] != '-')
    goto no_more_optchars;

  /* If, when getopt() is called argv[optind] points to the string "-",
     getopt() shall return -1 without changing optind. */
  if (strcmp(argv[optind], "-") == 0)
    goto no_more_optchars;

  /* If, when getopt() is called argv[optind] points to the string "--",
     getopt() shall return -1 after incrementing optind. */
  if (strcmp(argv[optind], "--") == 0) {
    ++optind;
    goto no_more_optchars;
  }

  if (optcursor == NULL || *optcursor == '\0')
    optcursor = argv[optind] + 1;

  optchar = *optcursor;

  /* FreeBSD: The variable optopt saves the last known option character
     returned by getopt(). */
  optopt = optchar;

  /* The getopt() function shall return the next option character (if one is
     found) from argv that matches a character in optstring, if there is
     one that matches. */
  optdecl = strchr(optstring, optchar);
  if (optdecl) {
    /* [I]f a character is followed by a colon, the option takes an
       argument. */
    if (optdecl[1] == ':') {
      optarg = ++optcursor;
      if (*optarg == '\0') {
        /* GNU extension: Two colons mean an option takes an
           optional arg; if there is text in the current argv-element
           (i.e., in the same word as the option name itself, for example,
           "-oarg"), then it is returned in optarg, otherwise optarg is set
           to zero. */
        if (optdecl[2] != ':') {
          /* If the option was the last character in the string pointed to by
             an element of argv, then optarg shall contain the next element
             of argv, and optind shall be incremented by 2. If the resulting
             value of optind is greater than argc, this indicates a missing
             option-argument, and getopt() shall return an error indication.

             Otherwise, optarg shall point to the string following the
             option character in that element of argv, and optind shall be
             incremented by 1.
          */
          if (++optind < argc) {
            optarg = argv[optind];
          } else {
            /* If it detects a missing option-argument, it shall return the
               colon character ( ':' ) if the first character of optstring
               was a colon, or a question-mark character ( '?' ) otherwise.
            */
            optarg = NULL;
            optchar = (optstring[0] == ':') ? ':' : '?';
          }
        } else {
          optarg = NULL;
        }
      }

      optcursor = NULL;
    }
  } else {
    /* If getopt() encounters an option character that is not contained in
       optstring, it shall return the question-mark ( '?' ) character. */
    optchar = '?';
  }

  if (optcursor == NULL || *++optcursor == '\0')
    ++optind;

  return optchar;

no_more_optchars:
  optcursor = NULL;
  return -1;
}